

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_modified(AMQP_VALUE value,MODIFIED_HANDLE *modified_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  MODIFIED_HANDLE pMVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  _Bool undeliverable_here;
  _Bool delivery_failed;
  fields message_annotations;
  uint local_38;
  _Bool local_32;
  _Bool local_31;
  AMQP_VALUE local_30;
  
  pMVar4 = (MODIFIED_HANDLE)malloc(8);
  if (pMVar4 == (MODIFIED_HANDLE)0x0) {
    *modified_handle = (MODIFIED_HANDLE)0x0;
    iVar3 = 0x46e5;
  }
  else {
    pMVar4->composite_value = (AMQP_VALUE)0x0;
    *modified_handle = pMVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      modified_destroy(*modified_handle);
      iVar3 = 0x46ed;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_38);
      iVar3 = 0x46f4;
      if (iVar1 == 0) {
        if (local_38 != 0) {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar6);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar3 = amqpvalue_get_boolean(pAVar6,&local_31), iVar3 != 0)) {
              amqpvalue_destroy(pAVar6);
              modified_destroy(*modified_handle);
              return 0x4710;
            }
            amqpvalue_destroy(pAVar6);
          }
          if (1 < local_38) {
            pAVar6 = amqpvalue_get_list_item(pAVar5,1);
            if (pAVar6 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar6);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar3 = amqpvalue_get_boolean(pAVar6,&local_32), iVar3 != 0)) {
                amqpvalue_destroy(pAVar6);
                modified_destroy(*modified_handle);
                return 0x472d;
              }
              amqpvalue_destroy(pAVar6);
            }
            if ((2 < local_38) &&
               (pAVar5 = amqpvalue_get_list_item(pAVar5,2), pAVar5 != (AMQP_VALUE)0x0)) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar3 = amqpvalue_get_map(pAVar5,&local_30), iVar3 != 0)) {
                amqpvalue_destroy(pAVar5);
                modified_destroy(*modified_handle);
                return 0x474a;
              }
              amqpvalue_destroy(pAVar5);
            }
          }
        }
        pAVar5 = amqpvalue_clone(value);
        pMVar4->composite_value = pAVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_modified(AMQP_VALUE value, MODIFIED_HANDLE* modified_handle)
{
    int result;
    MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified_create_internal();
    *modified_handle = modified_instance;
    if (*modified_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            modified_destroy(*modified_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* delivery-failed */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool delivery_failed;
                                if (amqpvalue_get_boolean(item_value, &delivery_failed) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* undeliverable-here */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool undeliverable_here;
                                if (amqpvalue_get_boolean(item_value, &undeliverable_here) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* message-annotations */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields message_annotations;
                                if (amqpvalue_get_fields(item_value, &message_annotations) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    modified_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}